

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_monsters(void)

{
  ushort uVar1;
  chunk_conflict2 *pcVar2;
  object *poVar3;
  chunk_conflict *pcVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  ulong uVar7;
  
  wVar6 = L'\0';
  if (player->is_dead == false) {
    wVar5 = rd_monsters_aux((chunk *)cave);
    wVar6 = L'\xffffffff';
    if (wVar5 == L'\0') {
      wVar5 = rd_monsters_aux((chunk *)player->cave);
      pcVar4 = cave;
      if (wVar5 == L'\0') {
        pcVar2 = player->cave;
        uVar1 = pcVar2->obj_max;
        wVar6 = L'\0';
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          if ((pcVar4->objects[uVar7] != (object *)0x0) &&
             (poVar3 = pcVar2->objects[uVar7], poVar3 != (object *)0x0)) {
            pcVar4->objects[uVar7]->known = poVar3;
          }
        }
      }
    }
  }
  return wVar6;
}

Assistant:

int rd_monsters(void)
{
	int i;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	if (rd_monsters_aux(cave))
		return -1;
	if (rd_monsters_aux(player->cave))
		return -1;

#if OBJ_RECOVER
	player->cave->objects = mem_zalloc((cave->obj_max + 1) * sizeof(struct object*));
	player->cave->obj_max = cave->obj_max;
	for (i = 0; i <= cave->obj_max; i++) {
		struct object *obj = cave->objects[i], *known_obj;
		if (!obj) continue;
		known_obj = object_new();
		obj->known = known_obj;
		object_copy(known_obj, obj);
		player->cave->objects[i] = known_obj;
	}
#else
	/* Associate known objects */
	for (i = 0; i < player->cave->obj_max; i++)
		if (cave->objects[i] && player->cave->objects[i])
			cave->objects[i]->known = player->cave->objects[i];
#endif
	return 0;
}